

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

string * get_index_type_name_abi_cxx11_(string *__return_storage_ptr__,IndexType type)

{
  runtime_error *this;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch(type) {
  case GRAM3:
    __s = "gram3";
    __a = &local_11;
    break;
  case TEXT4:
    __s = "text4";
    __a = &local_12;
    break;
  case HASH4:
    __s = "hash4";
    __a = &local_13;
    break;
  case WIDE8:
    __s = "wide8";
    __a = &local_14;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unhandled index type");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string get_index_type_name(IndexType type) {
    switch (type) {
        case IndexType::GRAM3:
            return "gram3";
        case IndexType::TEXT4:
            return "text4";
        case IndexType::HASH4:
            return "hash4";
        case IndexType::WIDE8:
            return "wide8";
    }

    throw std::runtime_error("unhandled index type");
}